

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceDynamicProfileManager.cpp
# Opt level: O1

uint __thiscall
Js::SourceDynamicProfileManager::SaveToProfileCache(SourceDynamicProfileManager *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (DAT_015b01c8 == '\0') {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceDynamicProfileManager.cpp"
                                ,0xb7,"((Js::Configuration::Global.flags.WininetProfileCache))",
                                "Profile caching should be enabled for us to get here");
    if (!bVar2) goto LAB_00b0e17b;
    *puVar3 = 0;
  }
  if ((this->startupFunctions).ptr == (BVFixed *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceDynamicProfileManager.cpp"
                                ,0xb8,"(startupFunctions)","startupFunctions");
    if (!bVar2) {
LAB_00b0e17b:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return 0;
}

Assistant:

uint SourceDynamicProfileManager::SaveToProfileCache()
    {
        AssertMsg(CONFIG_FLAG(WininetProfileCache), "Profile caching should be enabled for us to get here");
        Assert(startupFunctions);

        uint bytesWritten = 0;
#ifdef ENABLE_WININET_PROFILE_DATA_CACHE
        //TODO: Add some diffing logic to not write unless necessary
        ULONG byteCount = startupFunctions->WordCount() * sizeof(BVUnit) + sizeof(BVIndex);
        if (FAILED(dataCacheWrapper->StartBlock(SimpleDataCacheWrapper::BlockType::BlockType_ProfileData, byteCount)))
        {
            return 0;
        }

        if (FAILED(dataCacheWrapper->Write(startupFunctions->Length())))
        {
            return 0;
        }

        if (SUCCEEDED(dataCacheWrapper->WriteArray(startupFunctions->GetData(), startupFunctions->WordCount())))
        {
            bytesWritten = dataCacheWrapper->BytesWrittenInBlock();

#if DBG_DUMP
            if (PHASE_TRACE1(Js::DynamicProfilePhase) && Js::Configuration::Global.flags.Verbose)
            {
                OUTPUT_VERBOSE_TRACE(Js::DynamicProfilePhase, _u("Saved profile:\n"));
                startupFunctions->Dump();
            }
#endif
        }
#endif
        return bytesWritten;
    }